

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

void __thiscall
ipx::Basis::TableauRow(Basis *this,Int jb,IndexedVector *btran,IndexedVector *row,bool ignore_fixed)

{
  double dVar1;
  int iVar2;
  Int IVar3;
  Int IVar4;
  Int IVar5;
  Int IVar6;
  Int *pIVar7;
  double *pdVar8;
  Int *pIVar9;
  double *pdVar10;
  reference pvVar11;
  IndexedVector *in_RCX;
  IndexedVector *in_RDX;
  long in_RDI;
  byte in_R8B;
  Int p_1;
  Int end_1;
  Int begin_1;
  double result;
  Int j_1;
  double *Ax;
  Int *Ai;
  SparseMatrix *AI;
  Int k_2;
  Int j;
  Int p;
  Int end;
  Int begin;
  double temp;
  Int i_1;
  Int k_1;
  Int nz_1;
  Int *row_pattern;
  Int *bi_1;
  double *Atx;
  Int *Ati;
  SparseMatrix *AIt_1;
  Int i;
  Int k;
  Int nz;
  Int *bi;
  SparseMatrix *AIt;
  bool is_sparse;
  Int n;
  Int m;
  double in_stack_fffffffffffffee8;
  SparseMatrix *in_stack_fffffffffffffef0;
  IndexedVector *in_stack_ffffffffffffff00;
  double dVar12;
  int local_dc;
  double local_d0;
  int local_c4;
  IndexedVector *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  Basis *in_stack_ffffffffffffff50;
  int local_a4;
  int local_9c;
  int local_80;
  int local_7c;
  int local_48;
  int local_44;
  bool local_2d;
  
  IVar5 = (Int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  IVar3 = Model::rows(*(Model **)(in_RDI + 8));
  IVar4 = Model::cols(*(Model **)(in_RDI + 8));
  SolveForUpdate(in_stack_ffffffffffffff50,IVar5,in_stack_ffffffffffffff40);
  local_2d = IndexedVector::sparse(in_stack_ffffffffffffff00);
  if (local_2d) {
    Model::AIt(*(Model **)(in_RDI + 8));
    IndexedVector::pattern((IndexedVector *)0x80bd66);
    local_44 = 0;
    for (local_48 = 0; IVar5 = IndexedVector::nnz(in_RDX), local_48 < IVar5; local_48 = local_48 + 1
        ) {
      IVar5 = SparseMatrix::end(in_stack_fffffffffffffef0,
                                (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      IVar6 = SparseMatrix::begin(in_stack_fffffffffffffef0,
                                  (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      local_44 = (IVar5 - IVar6) + local_44;
    }
    if ((double)IVar4 * 0.1 < (double)(local_44 / 2)) {
      local_2d = false;
    }
  }
  if (local_2d == false) {
    Model::AI(*(Model **)(in_RDI + 8));
    SparseMatrix::rowidx((SparseMatrix *)0x80c14b);
    pdVar8 = SparseMatrix::values((SparseMatrix *)0x80c15a);
    for (local_c4 = 0; local_c4 < IVar4 + IVar3; local_c4 = local_c4 + 1) {
      local_d0 = 0.0;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)local_c4);
      if ((*pvVar11 == -1) ||
         ((pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)local_c4)
          , *pvVar11 == -2 && ((in_R8B & 1) == 0)))) {
        local_dc = SparseMatrix::begin(in_stack_fffffffffffffef0,
                                       (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        IVar5 = SparseMatrix::end(in_stack_fffffffffffffef0,
                                  (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        for (; local_dc < IVar5; local_dc = local_dc + 1) {
          in_stack_fffffffffffffef0 = (SparseMatrix *)pdVar8[local_dc];
          pdVar10 = IndexedVector::operator[]
                              ((IndexedVector *)in_stack_fffffffffffffef0,
                               (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
          local_d0 = (double)in_stack_fffffffffffffef0 * *pdVar10 + local_d0;
        }
      }
      pdVar10 = IndexedVector::operator[]
                          ((IndexedVector *)in_stack_fffffffffffffef0,(Int)((ulong)local_d0 >> 0x20)
                          );
      *pdVar10 = local_d0;
      in_stack_fffffffffffffee8 = local_d0;
    }
    IndexedVector::InvalidatePattern(in_RCX);
  }
  else {
    Model::AIt(*(Model **)(in_RDI + 8));
    pIVar7 = SparseMatrix::rowidx((SparseMatrix *)0x80be8d);
    pdVar8 = SparseMatrix::values((SparseMatrix *)0x80bea2);
    IndexedVector::pattern((IndexedVector *)0x80beb7);
    IndexedVector::set_to_zero(in_stack_ffffffffffffff00);
    pIVar9 = IndexedVector::pattern((IndexedVector *)0x80bed9);
    local_7c = 0;
    for (local_80 = 0; IVar3 = IndexedVector::nnz(in_RDX), local_80 < IVar3; local_80 = local_80 + 1
        ) {
      pdVar10 = IndexedVector::operator[]
                          ((IndexedVector *)in_stack_fffffffffffffef0,
                           (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      dVar1 = *pdVar10;
      local_9c = SparseMatrix::begin(in_stack_fffffffffffffef0,
                                     (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      IVar3 = SparseMatrix::end(in_stack_fffffffffffffef0,
                                (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      for (; local_9c < IVar3; local_9c = local_9c + 1) {
        iVar2 = pIVar7[local_9c];
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)iVar2);
        if ((*pvVar11 == -1) ||
           ((pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)iVar2),
            *pvVar11 == -2 && ((in_R8B & 1) == 0)))) {
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)iVar2);
          *pvVar11 = *pvVar11 + -2;
          pIVar9[local_7c] = iVar2;
          local_7c = local_7c + 1;
        }
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)iVar2);
        if (*pvVar11 < -2) {
          dVar12 = pdVar8[local_9c];
          pdVar10 = IndexedVector::operator[]
                              ((IndexedVector *)in_stack_fffffffffffffef0,
                               (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
          *pdVar10 = dVar1 * dVar12 + *pdVar10;
        }
      }
    }
    for (local_a4 = 0; local_a4 < local_7c; local_a4 = local_a4 + 1) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),
                           (long)pIVar9[local_a4]);
      *pvVar11 = *pvVar11 + 2;
    }
    IndexedVector::set_nnz(in_RCX,local_7c);
  }
  return;
}

Assistant:

void Basis::TableauRow(Int jb, IndexedVector& btran, IndexedVector& row,
                       bool ignore_fixed) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    assert(IsBasic(jb));
    SolveForUpdate(jb, btran);

    // Estimate if tableau row is sparse.
    bool is_sparse = btran.sparse();
    if (is_sparse) {
        const SparseMatrix& AIt = model_.AIt();
        const Int* bi = btran.pattern();
        Int nz = 0;
        for (Int k = 0; k < btran.nnz(); k++) {
            Int i = bi[k];
            nz += AIt.end(i) - AIt.begin(i);
        }
        nz /= 2;                // guess for overlap
        if (nz > kHypersparseThreshold*n)
            is_sparse = false;
    }

    if (is_sparse) {
        // sparse vector * sparse matrix: accesses A rowwise
        const SparseMatrix& AIt = model_.AIt();
        const Int* Ati = AIt.rowidx();
        const double* Atx = AIt.values();
        const Int* bi = btran.pattern();
        row.set_to_zero();
        Int* row_pattern = row.pattern();
        Int nz = 0;
        for (Int k = 0; k < btran.nnz(); k++) {
            Int i = bi[k];
            double temp = btran[i];
            Int begin = AIt.begin(i);
            Int end = AIt.end(i);
            for (Int p = begin; p < end; p++) {
                Int j = Ati[p];
                if (map2basis_[j] == -1 || (map2basis_[j] == -2 && !ignore_fixed))
                {
                    map2basis_[j] -= 2; // mark column
                    row_pattern[nz++] = j;
                }
                if (map2basis_[j] < -2) // marked column
                    row[j] += temp * Atx[p];
            }
        }
        for (Int k = 0; k < nz; k++) // reset marked
            map2basis_[row_pattern[k]] += 2;
        row.set_nnz(nz);
    } else {
        // dense vector * sparse matrix: accesses A columnwise
        const SparseMatrix& AI = model_.AI();
        const Int* Ai = AI.rowidx();
        const double* Ax = AI.values();
        for (Int j = 0; j < n+m; j++) {
            double result = 0.0;
            if (map2basis_[j] == -1 || (map2basis_[j] == -2 && !ignore_fixed)) {
                Int begin = AI.begin(j);
                Int end = AI.end(j);
                for (Int p = begin; p < end; p++)
                    result += Ax[p] * btran[Ai[p]];
            }
            row[j] = result;
        }
        row.InvalidatePattern();
    }
}